

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_scan_block_scalar_breaks
              (yaml_parser_t *parser,int *indent,yaml_string_t *breaks,yaml_mark_t start_mark,
              yaml_mark_t *end_mark)

{
  yaml_char_t **pointer;
  yaml_char_t **ppyVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  yaml_char_t *pyVar5;
  uint uVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  
  end_mark->column = (parser->mark).column;
  sVar7 = (parser->mark).line;
  end_mark->index = (parser->mark).index;
  end_mark->line = sVar7;
  pointer = &breaks->pointer;
  iVar9 = 0;
LAB_00114bc9:
  sVar7 = parser->unread;
  do {
    if ((sVar7 == 0) && (iVar2 = yaml_parser_update_buffer(parser,1), iVar2 == 0)) {
      return 0;
    }
    iVar2 = *indent;
    if (iVar2 == 0) {
      pbVar3 = (parser->buffer).pointer;
      sVar7 = (parser->mark).column;
      bVar10 = *pbVar3;
      if (bVar10 != 0x20) {
        iVar8 = (int)sVar7;
        if ((int)sVar7 < iVar9) {
          iVar8 = iVar9;
        }
        goto LAB_00114cc7;
      }
    }
    else {
      sVar7 = (parser->mark).column;
      iVar8 = (int)sVar7;
      if (iVar2 <= iVar8) {
        if (iVar9 <= iVar8) {
          iVar9 = iVar8;
        }
        pbVar3 = (parser->buffer).pointer;
        bVar10 = *pbVar3;
        goto LAB_00114cd1;
      }
      pbVar3 = (parser->buffer).pointer;
      if (*pbVar3 != 0x20) break;
    }
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = sVar7 + 1;
    sVar7 = parser->unread - 1;
    parser->unread = sVar7;
    bVar10 = *pbVar3;
    lVar4 = 1;
    if ((((char)bVar10 < '\0') && (lVar4 = 2, (bVar10 & 0xe0) != 0xc0)) &&
       (lVar4 = 3, (bVar10 & 0xf0) != 0xe0)) {
      lVar4 = (ulong)((bVar10 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar3 + lVar4;
  } while( true );
  if (iVar9 <= iVar8) {
    iVar9 = iVar8;
  }
  bVar10 = *pbVar3;
  iVar8 = iVar9;
LAB_00114cc7:
  iVar9 = iVar8;
  if (bVar10 == 9) {
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a block scalar";
    (parser->context_mark).index = start_mark.index;
    (parser->context_mark).line = start_mark.line;
    (parser->context_mark).column = start_mark.column;
    parser->problem = "found a tab character where an indentation space is expected";
    sVar7 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar7;
    (parser->problem_mark).column = (parser->mark).column;
    return 0;
  }
LAB_00114cd1:
  if (bVar10 < 0xc2) {
    if ((bVar10 != 10) && (bVar10 != 0xd)) {
LAB_00114ee4:
      if (iVar2 != 0) {
        return 1;
      }
      *indent = iVar9;
      iVar2 = parser->indent;
      iVar8 = iVar2 + 1;
      if (iVar2 < iVar9) {
        iVar8 = iVar9;
      }
      if (iVar9 <= iVar2 || iVar8 < 1) {
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        *indent = iVar8;
        return 1;
      }
      return 1;
    }
  }
  else if (((bVar10 == 0xe2) || (bVar10 != 0xc2)) || (pbVar3[1] != 0x85)) goto LAB_00114ee4;
  if ((parser->unread < 2) && (iVar2 = yaml_parser_update_buffer(parser,2), iVar2 == 0)) {
    return 0;
  }
  if ((breaks->end <= *pointer + 5) &&
     (iVar2 = yaml_string_extend(&breaks->start,pointer,&breaks->end), iVar2 == 0)) {
    parser->error = YAML_MEMORY_ERROR;
    return 0;
  }
  pbVar3 = (parser->buffer).pointer;
  bVar10 = *pbVar3;
  if (bVar10 < 0xc2) {
    if (bVar10 == 10) {
      pyVar5 = *pointer;
LAB_00114e59:
      *pointer = pyVar5 + 1;
      *pyVar5 = '\n';
      ppyVar1 = &(parser->buffer).pointer;
      *ppyVar1 = *ppyVar1 + 1;
      goto LAB_00114e8a;
    }
    if (bVar10 != 0xd) goto LAB_00114ecb;
    pyVar5 = *pointer;
    if (pbVar3[1] != 10) goto LAB_00114e59;
    *pointer = pyVar5 + 1;
    *pyVar5 = '\n';
    ppyVar1 = &(parser->buffer).pointer;
    *ppyVar1 = *ppyVar1 + 2;
    lVar4 = -2;
    uVar6 = 2;
  }
  else {
    if ((bVar10 != 0xc2) || (pbVar3[1] != 0x85)) goto LAB_00114ecb;
    pyVar5 = *pointer;
    *pointer = pyVar5 + 1;
    *pyVar5 = '\n';
    ppyVar1 = &(parser->buffer).pointer;
    *ppyVar1 = *ppyVar1 + 2;
LAB_00114e8a:
    lVar4 = -1;
    uVar6 = 1;
  }
  (parser->mark).column = 0;
  (parser->mark).index = (ulong)uVar6 + (parser->mark).index;
  (parser->mark).line = (parser->mark).line + 1;
  parser->unread = parser->unread + lVar4;
LAB_00114ecb:
  end_mark->column = (parser->mark).column;
  sVar7 = (parser->mark).line;
  end_mark->index = (parser->mark).index;
  end_mark->line = sVar7;
  goto LAB_00114bc9;
}

Assistant:

static int
yaml_parser_scan_block_scalar_breaks(yaml_parser_t *parser,
        int *indent, yaml_string_t *breaks,
        yaml_mark_t start_mark, yaml_mark_t *end_mark)
{
    int max_indent = 0;

    *end_mark = parser->mark;

    /* Eat the indentation spaces and line breaks. */

    while (1)
    {
        /* Eat the indentation spaces. */

        if (!CACHE(parser, 1)) return 0;

        while ((!*indent || (int)parser->mark.column < *indent)
                && IS_SPACE(parser->buffer)) {
            SKIP(parser);
            if (!CACHE(parser, 1)) return 0;
        }

        if ((int)parser->mark.column > max_indent)
            max_indent = (int)parser->mark.column;

        /* Check for a tab character messing the indentation. */

        if ((!*indent || (int)parser->mark.column < *indent)
                && IS_TAB(parser->buffer)) {
            return yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                    start_mark, "found a tab character where an indentation space is expected");
        }

        /* Have we found a non-empty line? */

        if (!IS_BREAK(parser->buffer)) break;

        /* Consume the line break. */

        if (!CACHE(parser, 2)) return 0;
        if (!READ_LINE(parser, *breaks)) return 0;
        *end_mark = parser->mark;
    }

    /* Determine the indentation level if needed. */

    if (!*indent) {
        *indent = max_indent;
        if (*indent < parser->indent + 1)
            *indent = parser->indent + 1;
        if (*indent < 1)
            *indent = 1;
    }

   return 1;
}